

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void Fl_Tooltip::enter_area(Fl_Widget *wid,int x,int y,int w,int h,char *t)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  char *t_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Widget *wid_local;
  
  if (recursion == '\0') {
    if (((t == (char *)0x0) || (*t == '\0')) || (iVar1 = enabled(), iVar1 == 0)) {
      exit_((Fl_Widget *)0x0);
    }
    else if ((wid != widget_) || (t != tip)) {
      Fl::remove_timeout(tooltip_timeout,(void *)0x0);
      Fl::remove_timeout(recent_timeout,(void *)0x0);
      widget_ = wid;
      tip = t;
      ::Y = y;
      ::H = h;
      if (recent_tooltip == '\0') {
        fVar3 = delay();
        if (0.1 <= fVar3) {
          if ((window != (Fl_TooltipBox *)0x0) &&
             (uVar2 = Fl_Widget::visible((Fl_Widget *)window), uVar2 != 0)) {
            (*(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
              super_Fl_Widget._vptr_Fl_Widget[6])();
          }
          fVar3 = delay();
          Fl::add_timeout((double)fVar3,tooltip_timeout,(void *)0x0);
        }
        else {
          tooltip_timeout((void *)0x0);
        }
      }
      else {
        if (window != (Fl_TooltipBox *)0x0) {
          (*(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[6])();
        }
        fVar3 = hoverdelay();
        Fl::add_timeout((double)fVar3,tooltip_timeout,(void *)0x0);
      }
    }
  }
  return;
}

Assistant:

void Fl_Tooltip::enter_area(Fl_Widget* wid, int x,int y,int w,int h, const char* t)
{
  (void)x;
  (void)w;

#ifdef DEBUG
  printf("Fl_Tooltip::enter_area(wid=%p, x=%d, y=%d, w=%d, h=%d, t=\"%s\")\n",
         wid, x, y, w, h, t ? t : "(null)");
  printf("    recursion=%d, window=%p\n", recursion, window);
#endif // DEBUG

  if (recursion) return;
  if (!t || !*t || !enabled()) {
    exit_(0);
    return;
  }
  // do nothing if it is the same:
  if (wid==widget_ /*&& x==X && y==Y && w==W && h==H*/ && t==tip) return;
  Fl::remove_timeout(tooltip_timeout);
  Fl::remove_timeout(recent_timeout);
  // remember it:
  widget_ = wid; Y = y; H = h; tip = t;
  // popup the tooltip immediately if it was recently up:
  if (recent_tooltip) {
    if (window) window->hide();
    Fl::add_timeout(Fl_Tooltip::hoverdelay(), tooltip_timeout);
  } else if (Fl_Tooltip::delay() < .1) {
#ifdef WIN32
    // possible fix for the Windows titlebar, it seems to want the
    // window to be destroyed, moving it messes up the parenting:
    if (window && window->visible()) window->hide();
#endif // WIN32
    tooltip_timeout(0);
  } else {
    if (window && window->visible()) window->hide();
    Fl::add_timeout(Fl_Tooltip::delay(), tooltip_timeout);
  }

#ifdef DEBUG
  printf("    tip=\"%s\", window->shown()=%d\n", tip ? tip : "(null)",
         window ? window->shown() : 0);
#endif // DEBUG
}